

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O2

void __thiscall Assimp::ObjFile::Mesh::~Mesh(Mesh *this)

{
  Face *this_00;
  pointer ppFVar1;
  
  for (ppFVar1 = (this->m_Faces).
                 super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (this->m_Faces).
      super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    this_00 = *ppFVar1;
    if (this_00 != (Face *)0x0) {
      Face::~Face(this_00);
    }
    operator_delete(this_00,0x58);
  }
  std::_Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::
  ~_Vector_base(&(this->m_Faces).
                 super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
               );
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Mesh() {
        for (std::vector<Face*>::iterator it = m_Faces.begin();
            it != m_Faces.end(); ++it)
        {
            delete *it;
        }
    }